

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::move(Tree *this,size_t node,size_t after)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  char msg_3 [90];
  char msg_2 [32];
  char msg_1 [30];
  char msg [29];
  size_t in_stack_000002b8;
  size_t in_stack_000002c0;
  size_t in_stack_000002c8;
  Tree *in_stack_000002d0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  char *in_stack_fffffffffffffe18;
  Location *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe48;
  Tree *in_stack_fffffffffffffe50;
  undefined4 local_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined1 local_168 [16];
  size_t in_stack_fffffffffffffea8;
  Tree *in_stack_fffffffffffffeb0;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 local_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  char *local_e0;
  char local_d8 [40];
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  char *local_90;
  char local_88 [40];
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  char *local_40;
  char local_38 [32];
  long local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_RSI == -1) {
    builtin_strncpy(local_38,"check failed: (node != NONE)",0x1d);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                       CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                       CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    (*pcVar1)(local_38,0x1d,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffdf8 = local_60;
    in_stack_fffffffffffffdfc = uStack_5c;
    in_stack_fffffffffffffe00 = uStack_58;
    in_stack_fffffffffffffe04 = uStack_54;
    in_stack_fffffffffffffe08 = local_50;
    in_stack_fffffffffffffe0c = uStack_4c;
    in_stack_fffffffffffffe10 = uStack_48;
    in_stack_fffffffffffffe14 = uStack_44;
    in_stack_fffffffffffffe18 = local_40;
  }
  if (local_10 == local_18) {
    builtin_strncpy(local_88,"check failed: (node != after)",0x1e);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    in_stack_fffffffffffffe50 = *(Tree **)(in_RDI + 0x58);
    in_stack_fffffffffffffe48 = local_88;
    Location::Location(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                       CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                       CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    (*(code *)in_stack_fffffffffffffe50)
              (in_stack_fffffffffffffe48,0x1e,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffdf8 = local_b0;
    in_stack_fffffffffffffdfc = uStack_ac;
    in_stack_fffffffffffffe00 = uStack_a8;
    in_stack_fffffffffffffe04 = uStack_a4;
    in_stack_fffffffffffffe08 = local_a0;
    in_stack_fffffffffffffe0c = uStack_9c;
    in_stack_fffffffffffffe10 = uStack_98;
    in_stack_fffffffffffffe14 = uStack_94;
    in_stack_fffffffffffffe18 = local_90;
  }
  bVar2 = is_root(in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
  if (bVar2) {
    builtin_strncpy(local_d8,"check failed: (! is_root(node))",0x20);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                       CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                       CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    (*pcVar1)(local_d8,0x20,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffdf8 = local_100;
    in_stack_fffffffffffffdfc = uStack_fc;
    in_stack_fffffffffffffe00 = uStack_f8;
    in_stack_fffffffffffffe04 = uStack_f4;
    in_stack_fffffffffffffe08 = local_f0;
    in_stack_fffffffffffffe0c = uStack_ec;
    in_stack_fffffffffffffe10 = uStack_e8;
    in_stack_fffffffffffffe14 = uStack_e4;
    in_stack_fffffffffffffe18 = local_e0;
  }
  if ((local_18 != -1) &&
     ((bVar2 = has_sibling((Tree *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                           CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                           CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00)), !bVar2 ||
      (bVar2 = has_sibling((Tree *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                           CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                           CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00)), !bVar2)))
     ) {
    memcpy(local_168,
           "check failed: ((after == NONE) || (has_sibling(node, after) && has_sibling(after, node)))"
           ,0x5a);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                       CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                       CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    (*pcVar1)(local_168,0x5a,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffdf8 = local_190;
    in_stack_fffffffffffffdfc = uStack_18c;
    in_stack_fffffffffffffe00 = uStack_188;
    in_stack_fffffffffffffe04 = uStack_184;
  }
  _rem_hierarchy(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  parent((Tree *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  _set_hierarchy(in_stack_000002d0,in_stack_000002c8,in_stack_000002c0,in_stack_000002b8);
  return;
}

Assistant:

void Tree::move(size_t node, size_t after)
{
    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    _RYML_CB_ASSERT(m_callbacks, node != after);
    _RYML_CB_ASSERT(m_callbacks,  ! is_root(node));
    _RYML_CB_ASSERT(m_callbacks, (after == NONE) || (has_sibling(node, after) && has_sibling(after, node)));

    _rem_hierarchy(node);
    _set_hierarchy(node, parent(node), after);
}